

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

void scm::define(Environment *env,string *key,Object *value)

{
  bool bVar1;
  mapped_type pOVar2;
  Verbosity VVar3;
  mapped_type *ppOVar4;
  Object *obj;
  double __x;
  string local_40;
  mapped_type local_20;
  Object *value_local;
  string *key_local;
  Environment *env_local;
  
  local_20 = value;
  value_local = (Object *)key;
  key_local = (string *)env;
  VVar3 = loguru::current_verbosity_cutoff();
  bVar1 = false;
  if ((-1 < VVar3) && ((LOG_ENVIRONMENT & 1) != 0)) {
    std::__cxx11::string::c_str();
    toString_abi_cxx11_(&local_40,(scm *)local_20,obj);
    bVar1 = true;
    __x = (double)std::__cxx11::string::c_str();
    loguru::log(__x);
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  pOVar2 = local_20;
  ppOVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*>_>_>
                          *)key_local,(key_type *)value_local);
  *ppOVar4 = pOVar2;
  return;
}

Assistant:

void define(Environment& env, std::string& key, Object* value)
{
  DLOG_IF_F(INFO, LOG_ENVIRONMENT, "define %s := %s", key.c_str(), toString(value).c_str());
  env.bindings[key] = value;
}